

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

WeightParams * __thiscall
CoreML::Specification::BatchnormLayerParams::_internal_mutable_beta(BatchnormLayerParams *this)

{
  Arena *arena;
  WeightParams *pWVar1;
  WeightParams *p;
  BatchnormLayerParams *this_local;
  
  if (this->beta_ == (WeightParams *)0x0) {
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pWVar1 = google::protobuf::MessageLite::CreateMaybeMessage<CoreML::Specification::WeightParams>
                       (arena);
    this->beta_ = pWVar1;
  }
  return this->beta_;
}

Assistant:

inline ::CoreML::Specification::WeightParams* BatchnormLayerParams::_internal_mutable_beta() {
  
  if (beta_ == nullptr) {
    auto* p = CreateMaybeMessage<::CoreML::Specification::WeightParams>(GetArenaForAllocation());
    beta_ = p;
  }
  return beta_;
}